

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<std::complex<float>_> * __thiscall
webrtc::Matrix<std::complex<float>_>::Transpose
          (Matrix<std::complex<float>_> *this,Matrix<std::complex<float>_> *operand)

{
  string *result;
  Matrix<std::complex<float>_> *pMVar1;
  int line;
  FatalMessage FStack_188;
  
  if (operand->num_rows_ != this->num_columns_) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&operand->num_rows_,&this->num_columns_,"operand.num_rows_ == num_columns_")
    ;
    if (result != (string *)0x0) {
      line = 0x8c;
      goto LAB_00174434;
    }
  }
  if (operand->num_columns_ != this->num_rows_) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&operand->num_columns_,&this->num_rows_,"operand.num_columns_ == num_rows_")
    ;
    if (result != (string *)0x0) {
      line = 0x8d;
LAB_00174434:
      rtc::FatalMessage::FatalMessage
                (&FStack_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&FStack_188);
    }
  }
  pMVar1 = Transpose(this,(operand->elements_).
                          super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  return pMVar1;
}

Assistant:

Matrix& Transpose(const Matrix& operand) {
    RTC_CHECK_EQ(operand.num_rows_, num_columns_);
    RTC_CHECK_EQ(operand.num_columns_, num_rows_);

    return Transpose(operand.elements());
  }